

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

DETACH_HANDLE detach_create(handle handle_value)

{
  int iVar1;
  DETACH_INSTANCE_TAG DVar2;
  AMQP_VALUE item_value;
  undefined4 local_24;
  int result;
  AMQP_VALUE handle_amqp_value;
  DETACH_INSTANCE *detach_instance;
  handle handle_value_local;
  
  handle_amqp_value = (AMQP_VALUE)malloc(8);
  if (handle_amqp_value != (AMQP_VALUE)0x0) {
    DVar2.composite_value = amqpvalue_create_composite_with_ulong_descriptor(0x16);
    *(AMQP_VALUE *)handle_amqp_value = DVar2.composite_value;
    if (*(AMQP_VALUE *)handle_amqp_value == (AMQP_VALUE)0x0) {
      free(handle_amqp_value);
      handle_amqp_value = (AMQP_VALUE)0x0;
    }
    else {
      local_24 = 0;
      item_value = amqpvalue_create_handle(handle_value);
      iVar1 = amqpvalue_set_composite_item(*(AMQP_VALUE *)handle_amqp_value,0,item_value);
      if (iVar1 != 0) {
        local_24 = 0x23a2;
      }
      amqpvalue_destroy(item_value);
      if (local_24 != 0) {
        detach_destroy((DETACH_HANDLE)handle_amqp_value);
        handle_amqp_value = (AMQP_VALUE)0x0;
      }
    }
  }
  return (DETACH_HANDLE)handle_amqp_value;
}

Assistant:

DETACH_HANDLE detach_create(handle handle_value)
{
    DETACH_INSTANCE* detach_instance = (DETACH_INSTANCE*)malloc(sizeof(DETACH_INSTANCE));
    if (detach_instance != NULL)
    {
        detach_instance->composite_value = amqpvalue_create_composite_with_ulong_descriptor(22);
        if (detach_instance->composite_value == NULL)
        {
            free(detach_instance);
            detach_instance = NULL;
        }
        else
        {
            AMQP_VALUE handle_amqp_value;
            int result = 0;

            handle_amqp_value = amqpvalue_create_handle(handle_value);
            if ((result == 0) && (amqpvalue_set_composite_item(detach_instance->composite_value, 0, handle_amqp_value) != 0))
            {
                result = MU_FAILURE;
            }

            amqpvalue_destroy(handle_amqp_value);
            if (result != 0)
            {
                detach_destroy(detach_instance);
                detach_instance = NULL;
            }
        }
    }

    return detach_instance;
}